

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int child_stop(archive_read_filter *self,program_filter *state)

{
  __pid_t _Var1;
  int *piVar2;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  int local_4;
  
  if (*(int *)(in_RSI + 0x24) != -1) {
    close(*(int *)(in_RSI + 0x24));
    *(undefined4 *)(in_RSI + 0x24) = 0xffffffff;
  }
  if (*(int *)(in_RSI + 0x28) != -1) {
    close(*(int *)(in_RSI + 0x28));
    *(undefined4 *)(in_RSI + 0x28) = 0xffffffff;
  }
  if (*(int *)(in_RSI + 0x18) != 0) {
    do {
      _Var1 = waitpid(*(__pid_t *)(in_RSI + 0x18),(int *)(in_RSI + 0x1c),0);
      *(__pid_t *)(in_RSI + 0x20) = _Var1;
      bVar3 = false;
      if (*(int *)(in_RSI + 0x20) == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    *(undefined4 *)(in_RSI + 0x18) = 0;
  }
  if (*(int *)(in_RSI + 0x20) < 0) {
    archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Child process exited badly");
    local_4 = -0x14;
  }
  else if ((char)(((byte)*(undefined4 *)(in_RSI + 0x1c) & 0x7f) + 1) >> 1 < '\x01') {
    if ((*(uint *)(in_RSI + 0x1c) & 0x7f) == 0) {
      if ((int)(*(uint *)(in_RSI + 0x1c) & 0xff00) >> 8 == 0) {
        local_4 = 0;
      }
      else {
        archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Child process exited with status %d",
                          (ulong)(uint)((int)(*(uint *)(in_RSI + 0x1c) & 0xff00) >> 8));
        local_4 = -0x14;
      }
    }
    else {
      local_4 = -0x14;
    }
  }
  else if ((*(uint *)(in_RSI + 0x1c) & 0x7f) == 0xd) {
    local_4 = 0;
  }
  else {
    archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Child process exited with signal %d",
                      (ulong)(*(uint *)(in_RSI + 0x1c) & 0x7f));
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
child_stop(struct archive_read_filter *self, struct program_filter *state)
{
	/* Close our side of the I/O with the child. */
	if (state->child_stdin != -1) {
		close(state->child_stdin);
		state->child_stdin = -1;
	}
	if (state->child_stdout != -1) {
		close(state->child_stdout);
		state->child_stdout = -1;
	}

	if (state->child != 0) {
		/* Reap the child. */
		do {
			state->waitpid_return
			    = waitpid(state->child, &state->exit_status, 0);
		} while (state->waitpid_return == -1 && errno == EINTR);
#if defined(_WIN32) && !defined(__CYGWIN__)
		CloseHandle(state->child);
#endif
		state->child = 0;
	}

	if (state->waitpid_return < 0) {
		/* waitpid() failed?  This is ugly. */
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Child process exited badly");
		return (ARCHIVE_WARN);
	}

#if !defined(_WIN32) || defined(__CYGWIN__)
	if (WIFSIGNALED(state->exit_status)) {
#ifdef SIGPIPE
		/* If the child died because we stopped reading before
		 * it was done, that's okay.  Some archive formats
		 * have padding at the end that we routinely ignore. */
		/* The alternative to this would be to add a step
		 * before close(child_stdout) above to read from the
		 * child until the child has no more to write. */
		if (WTERMSIG(state->exit_status) == SIGPIPE)
			return (ARCHIVE_OK);
#endif
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Child process exited with signal %d",
		    WTERMSIG(state->exit_status));
		return (ARCHIVE_WARN);
	}
#endif /* !_WIN32 || __CYGWIN__ */

	if (WIFEXITED(state->exit_status)) {
		if (WEXITSTATUS(state->exit_status) == 0)
			return (ARCHIVE_OK);

		archive_set_error(&self->archive->archive,
		    ARCHIVE_ERRNO_MISC,
		    "Child process exited with status %d",
		    WEXITSTATUS(state->exit_status));
		return (ARCHIVE_WARN);
	}

	return (ARCHIVE_WARN);
}